

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O3

bool __thiscall
Clasp::mt::ParallelSolve::SharedData::enterWait(SharedData *this,unique_lock<std::mutex> *lock)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = this->waiting + 1;
  uVar1 = (this->threads).super___atomic_base<unsigned_int>._M_i;
  if (uVar2 < uVar1) {
    this->waiting = this->waiting + 1;
    std::condition_variable::wait((unique_lock *)&this->workCond);
    this->waiting = this->waiting - 1;
  }
  return uVar2 < uVar1;
}

Assistant:

bool enterWait(unique_lock<mutex>& lock) {
		assert(lock.owns_lock());
		if ((waiting + 1) >= threads)
			return false;
		++waiting;
		workCond.wait(lock);
		--waiting;
		return true;
	}